

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

void __thiscall
kj::ArrayBuilder<kj::Array<unsigned_char>_>::dispose(ArrayBuilder<kj::Array<unsigned_char>_> *this)

{
  Array<unsigned_char> *firstElement;
  RemoveConst<kj::Array<unsigned_char>_> *pRVar1;
  Array<unsigned_char> *pAVar2;
  Array<unsigned_char> *endCopy;
  Array<unsigned_char> *posCopy;
  Array<unsigned_char> *ptrCopy;
  ArrayBuilder<kj::Array<unsigned_char>_> *this_local;
  
  firstElement = this->ptr;
  pRVar1 = this->pos;
  pAVar2 = this->endPtr;
  if (firstElement != (Array<unsigned_char> *)0x0) {
    this->ptr = (Array<unsigned_char> *)0x0;
    this->pos = (RemoveConst<kj::Array<unsigned_char>_> *)0x0;
    this->endPtr = (Array<unsigned_char> *)0x0;
    ArrayDisposer::dispose<kj::Array<unsigned_char>>
              (this->disposer,firstElement,((long)pRVar1 - (long)firstElement) / 0x18,
               ((long)pAVar2 - (long)firstElement) / 0x18);
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    T* posCopy = pos;
    T* endCopy = endPtr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      pos = nullptr;
      endPtr = nullptr;
      disposer->dispose(ptrCopy, posCopy - ptrCopy, endCopy - ptrCopy);
    }
  }